

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O0

int xmlACatalogRemove(xmlCatalogPtr catal,xmlChar *value)

{
  int local_24;
  int res;
  xmlChar *value_local;
  xmlCatalogPtr catal_local;
  
  if ((catal == (xmlCatalogPtr)0x0) || (value == (xmlChar *)0x0)) {
    catal_local._4_4_ = -1;
  }
  else {
    if (catal->type == XML_XML_CATALOG_TYPE) {
      local_24 = xmlDelXMLCatalog(catal->xml,value);
    }
    else {
      local_24 = xmlHashRemoveEntry(catal->sgml,value,xmlFreeCatalogEntry);
      if (local_24 == 0) {
        local_24 = 1;
      }
    }
    catal_local._4_4_ = local_24;
  }
  return catal_local._4_4_;
}

Assistant:

int
xmlACatalogRemove(xmlCatalogPtr catal, const xmlChar *value) {
    int res = -1;

    if ((catal == NULL) || (value == NULL))
	return(-1);

    if (catal->type == XML_XML_CATALOG_TYPE) {
	res = xmlDelXMLCatalog(catal->xml, value);
    } else {
	res = xmlHashRemoveEntry(catal->sgml, value, xmlFreeCatalogEntry);
	if (res == 0)
	    res = 1;
    }
    return(res);
}